

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::TextureSpecCase::verifyTex2D
          (TextureSpecCase *this,GLContext *gles2Context,ReferenceContext *refContext)

{
  uint uVar1;
  TestLog *log;
  bool bVar2;
  uint uVar3;
  RenderTarget *pRVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int width;
  int height;
  int iVar8;
  int local_13c;
  Vector<bool,_4> local_134;
  ContextWrapper *local_130;
  TextureFormat local_128;
  Surface result;
  Surface reference;
  Vector<int,_4> local_e0;
  Vector<int,_4> local_d0;
  Vector<int,_4> local_c0;
  IVec4 accurateFmtBits;
  IVec4 pixelFormatBits;
  UVec4 threshold;
  IVec4 compareBits;
  IVec4 texFormatBits;
  
  local_13c = 1;
  if ((this->m_flags & 1) != 0) {
    uVar1 = this->m_width;
    uVar3 = 0x20;
    uVar6 = uVar3;
    if (uVar1 != 0) {
      uVar6 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar6 == 0; uVar6 = uVar6 - 1) {
        }
      }
      uVar6 = uVar6 ^ 0x1f;
    }
    uVar1 = this->m_height;
    if (uVar1 != 0) {
      uVar3 = 0x1f;
      if (uVar1 != 0) {
        for (; uVar1 >> uVar3 == 0; uVar3 = uVar3 - 1) {
        }
      }
      uVar3 = uVar3 ^ 0x1f;
    }
    local_13c = 0x1f - uVar3;
    if ((int)(0x1f - uVar3) < (int)(0x1f - uVar6)) {
      local_13c = 0x1f - uVar6;
    }
    local_13c = local_13c + 1;
  }
  local_130 = &this->super_ContextWrapper;
  iVar5 = 0;
  do {
    if (local_13c == iVar5) {
      return;
    }
    iVar8 = this->m_width >> ((byte)iVar5 & 0x1f);
    width = 1;
    if (1 < iVar8) {
      width = iVar8;
    }
    iVar7 = this->m_height >> ((byte)iVar5 & 0x1f);
    height = 1;
    if (1 < iVar7) {
      height = iVar7;
    }
    tcu::Surface::Surface(&reference);
    tcu::Surface::Surface(&result);
    if (iVar8 < 3 || iVar7 < 3) {
      tcu::Surface::~Surface(&result);
      tcu::Surface::~Surface(&reference);
    }
    else {
      sglr::ContextWrapper::setContext(local_130,&gles2Context->super_Context);
      renderTex2D(this,&result,width,height);
      sglr::ContextWrapper::setContext(local_130,&refContext->super_Context);
      renderTex2D(this,&reference,width,height);
      pRVar4 = Context::getRenderTarget((this->super_TestCase).m_context);
      local_128 = this->m_texFormat;
      tcu::getTextureFormatBitDepth((tcu *)&texFormatBits,&local_128);
      pixelFormatBits.m_data[0] = (pRVar4->m_pixelFormat).redBits;
      pixelFormatBits.m_data[1] = pixelFormatBits.m_data[0];
      pixelFormatBits.m_data[2] = pixelFormatBits.m_data[0];
      if (1 < local_128.order - L) {
        pixelFormatBits.m_data[1] = (pRVar4->m_pixelFormat).greenBits;
        pixelFormatBits.m_data[2] = (pRVar4->m_pixelFormat).blueBits;
      }
      pixelFormatBits.m_data[3] = (pRVar4->m_pixelFormat).alphaBits;
      tcu::min<int,4>((tcu *)&accurateFmtBits,&pixelFormatBits,(Vector<int,_4> *)&texFormatBits);
      tcu::Vector<int,_4>::Vector(&local_e0,8);
      tcu::Vector<int,_4>::Vector(&local_c0,0);
      tcu::greaterThan<int,4>((tcu *)&local_134,&accurateFmtBits,&local_c0);
      tcu::select<int,4>((tcu *)&local_d0,&accurateFmtBits,&local_e0,&local_134);
      tcu::operator-((tcu *)&compareBits,&local_d0,1);
      tcu::Vector<int,_4>::Vector(&local_e0,1);
      tcu::operator-((tcu *)&local_c0,8,&compareBits);
      tcu::operator<<((tcu *)&local_d0,&local_e0,&local_c0);
      tcu::Vector<int,_4>::cast<unsigned_int>((Vector<int,_4> *)&threshold);
      log = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      tcu::Surface::getAccess((PixelBufferAccess *)&texFormatBits,&reference);
      tcu::Surface::getAccess((PixelBufferAccess *)&pixelFormatBits,&result);
      bVar2 = tcu::intThresholdCompare
                        (log,"Result","Image comparison result",
                         (ConstPixelBufferAccess *)&texFormatBits,
                         (ConstPixelBufferAccess *)&pixelFormatBits,&threshold,
                         COMPARE_LOG_ON_ERROR - (iVar5 == 0));
      if (!bVar2) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Image comparison failed");
        tcu::Surface::~Surface(&result);
        tcu::Surface::~Surface(&reference);
        return;
      }
      tcu::Surface::~Surface(&result);
      tcu::Surface::~Surface(&reference);
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void TextureSpecCase::verifyTex2D (sglr::GLContext& gles2Context, sglr::ReferenceContext& refContext)
{
	int numLevels = (m_flags & MIPMAPS) ? de::max(deLog2Floor32(m_width), deLog2Floor32(m_height))+1 : 1;

	DE_ASSERT(m_texType == TEXTURETYPE_2D);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		int				levelW		= de::max(1, m_width >> levelNdx);
		int				levelH		= de::max(1, m_height >> levelNdx);
		tcu::Surface	reference;
		tcu::Surface	result;

		if (levelW <= 2 || levelH <= 2)
			continue; // Don't bother checking.

		// Render with GLES2
		setContext(&gles2Context);
		renderTex2D(result, levelW, levelH);

		// Render reference.
		setContext(&refContext);
		renderTex2D(reference, levelW, levelH);

		{
			tcu::UVec4	threshold	= computeCompareThreshold(m_context.getRenderTarget().getPixelFormat(), m_texFormat);
			bool		isOk		= tcu::intThresholdCompare(m_testCtx.getLog(), "Result", "Image comparison result", reference.getAccess(), result.getAccess(), threshold,
															   levelNdx == 0 ? tcu::COMPARE_LOG_RESULT : tcu::COMPARE_LOG_ON_ERROR);

			if (!isOk)
			{
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Image comparison failed");
				break;
			}
		}
	}
}